

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QPodArrayOps<QPoint>::emplace<QPoint_const&>
          (QPodArrayOps<QPoint> *this,qsizetype i,QPoint *args)

{
  QPoint **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  QPoint QVar4;
  QPoint *pQVar5;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<QPoint>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_0011ba59:
    QVar4 = *args;
    where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<QPoint>).size != 0);
    QArrayDataPointer<QPoint>::detachAndGrow
              (&this->super_QArrayDataPointer<QPoint>,where,1,(QPoint **)0x0,
               (QArrayDataPointer<QPoint> *)0x0);
    pQVar5 = createHole(this,where,i,1);
    *pQVar5 = QVar4;
  }
  else {
    if (((this->super_QArrayDataPointer<QPoint>).size == i) &&
       (pQVar5 = (this->super_QArrayDataPointer<QPoint>).ptr,
       (pDVar3->super_QArrayData).alloc !=
       ((long)((long)pQVar5 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) +
       i)) {
      pQVar5[i] = *args;
    }
    else {
      if ((i != 0) ||
         (pQVar5 = (this->super_QArrayDataPointer<QPoint>).ptr,
         (QPoint *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
         pQVar5)) goto LAB_0011ba59;
      pQVar5[-1] = *args;
      ppQVar1 = &(this->super_QArrayDataPointer<QPoint>).ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QPoint>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }